

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O0

void deqp::gles31::bb::anon_unknown_11::copyBufferVarData
               (BufferVarLayoutEntry *dstEntry,BlockDataPtr *dstBlockPtr,
               BufferVarLayoutEntry *srcEntry,BlockDataPtr *srcBlockPtr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  void *pvVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  void *dst;
  void *src;
  int local_dc;
  int local_cc;
  int local_b8;
  int local_b4;
  deUint8 *srcCompPtr;
  deUint8 *dstCompPtr;
  int rowNdx;
  int colNdx;
  int numCols;
  int numRows;
  deUint8 *srcElemPtr;
  deUint8 *dstElemPtr;
  int elementNdx;
  deUint8 *srcTopPtr;
  deUint8 *dstTopPtr;
  int topElemNdx;
  int srcTopLevelStride;
  int srcTopLevelSize;
  int srcArrayStride;
  int srcArraySize;
  int dstTopLevelStride;
  int dstTopLevelSize;
  int dstArrayStride;
  int dstArraySize;
  int compSize;
  bool isMatrix;
  int scalarSize;
  deUint8 *srcBasePtr;
  deUint8 *dstBasePtr;
  BlockDataPtr *srcBlockPtr_local;
  BufferVarLayoutEntry *srcEntry_local;
  BlockDataPtr *dstBlockPtr_local;
  BufferVarLayoutEntry *dstEntry_local;
  
  pvVar7 = dstBlockPtr->ptr;
  iVar1 = dstEntry->offset;
  pvVar8 = srcBlockPtr->ptr;
  iVar2 = srcEntry->offset;
  iVar10 = glu::getDataTypeScalarSize(dstEntry->type);
  bVar9 = glu::isDataTypeMatrix(dstEntry->type);
  if (dstEntry->arraySize == 0) {
    local_b4 = dstBlockPtr->lastUnsizedArraySize;
  }
  else {
    local_b4 = dstEntry->arraySize;
  }
  iVar3 = dstEntry->arrayStride;
  if (dstEntry->topLevelArraySize == 0) {
    local_b8 = dstBlockPtr->lastUnsizedArraySize;
  }
  else {
    local_b8 = dstEntry->topLevelArraySize;
  }
  iVar4 = dstEntry->topLevelArrayStride;
  iVar5 = srcEntry->arrayStride;
  iVar6 = srcEntry->topLevelArrayStride;
  for (dstTopPtr._0_4_ = 0; (int)dstTopPtr < local_b8; dstTopPtr._0_4_ = (int)dstTopPtr + 1) {
    for (dstElemPtr._4_4_ = 0; dstElemPtr._4_4_ < local_b4; dstElemPtr._4_4_ = dstElemPtr._4_4_ + 1)
    {
      dst = (void *)((long)pvVar7 +
                    (long)(dstElemPtr._4_4_ * iVar3) + (long)((int)dstTopPtr * iVar4) + (long)iVar1)
      ;
      src = (void *)((long)pvVar8 +
                    (long)(dstElemPtr._4_4_ * iVar5) + (long)((int)dstTopPtr * iVar6) + (long)iVar2)
      ;
      if (bVar9) {
        iVar11 = glu::getDataTypeMatrixNumRows(dstEntry->type);
        iVar12 = glu::getDataTypeMatrixNumColumns(dstEntry->type);
        for (dstCompPtr._4_4_ = 0; dstCompPtr._4_4_ < iVar12;
            dstCompPtr._4_4_ = dstCompPtr._4_4_ + 1) {
          for (dstCompPtr._0_4_ = 0; (int)dstCompPtr < iVar11;
              dstCompPtr._0_4_ = (int)dstCompPtr + 1) {
            if ((dstEntry->isRowMajor & 1U) == 0) {
              local_cc = dstCompPtr._4_4_ * dstEntry->matrixStride + (int)dstCompPtr * 4;
            }
            else {
              local_cc = (int)dstCompPtr * dstEntry->matrixStride + dstCompPtr._4_4_ * 4;
            }
            if ((srcEntry->isRowMajor & 1U) == 0) {
              local_dc = dstCompPtr._4_4_ * srcEntry->matrixStride + (int)dstCompPtr * 4;
            }
            else {
              local_dc = (int)dstCompPtr * srcEntry->matrixStride + dstCompPtr._4_4_ * 4;
            }
            ::deMemcpy((void *)((long)dst + (long)local_cc),(void *)((long)src + (long)local_dc),4);
          }
        }
      }
      else {
        ::deMemcpy(dst,src,(long)(iVar10 << 2));
      }
    }
  }
  return;
}

Assistant:

void copyBufferVarData (const BufferVarLayoutEntry& dstEntry, const BlockDataPtr& dstBlockPtr, const BufferVarLayoutEntry& srcEntry, const BlockDataPtr& srcBlockPtr)
{
	DE_ASSERT(dstEntry.arraySize <= srcEntry.arraySize);
	DE_ASSERT(dstEntry.topLevelArraySize <= srcEntry.topLevelArraySize);
	DE_ASSERT(dstBlockPtr.lastUnsizedArraySize <= srcBlockPtr.lastUnsizedArraySize);
	DE_ASSERT(dstEntry.type == srcEntry.type);

	deUint8* const			dstBasePtr			= (deUint8*)dstBlockPtr.ptr + dstEntry.offset;
	const deUint8* const	srcBasePtr			= (const deUint8*)srcBlockPtr.ptr + srcEntry.offset;
	const int				scalarSize			= glu::getDataTypeScalarSize(dstEntry.type);
	const bool				isMatrix			= glu::isDataTypeMatrix(dstEntry.type);
	const int				compSize			= sizeof(deUint32);
	const int				dstArraySize		= dstEntry.arraySize == 0 ? dstBlockPtr.lastUnsizedArraySize : dstEntry.arraySize;
	const int				dstArrayStride		= dstEntry.arrayStride;
	const int				dstTopLevelSize		= dstEntry.topLevelArraySize == 0 ? dstBlockPtr.lastUnsizedArraySize : dstEntry.topLevelArraySize;
	const int				dstTopLevelStride	= dstEntry.topLevelArrayStride;
	const int				srcArraySize		= srcEntry.arraySize == 0 ? srcBlockPtr.lastUnsizedArraySize : srcEntry.arraySize;
	const int				srcArrayStride		= srcEntry.arrayStride;
	const int				srcTopLevelSize		= srcEntry.topLevelArraySize == 0 ? srcBlockPtr.lastUnsizedArraySize : srcEntry.topLevelArraySize;
	const int				srcTopLevelStride	= srcEntry.topLevelArrayStride;

	DE_ASSERT(dstArraySize <= srcArraySize && dstTopLevelSize <= srcTopLevelSize);
	DE_UNREF(srcArraySize && srcTopLevelSize);

	for (int topElemNdx = 0; topElemNdx < dstTopLevelSize; topElemNdx++)
	{
		deUint8* const			dstTopPtr	= dstBasePtr + topElemNdx*dstTopLevelStride;
		const deUint8* const	srcTopPtr	= srcBasePtr + topElemNdx*srcTopLevelStride;

		for (int elementNdx = 0; elementNdx < dstArraySize; elementNdx++)
		{
			deUint8* const			dstElemPtr	= dstTopPtr + elementNdx*dstArrayStride;
			const deUint8* const	srcElemPtr	= srcTopPtr + elementNdx*srcArrayStride;

			if (isMatrix)
			{
				const int	numRows	= glu::getDataTypeMatrixNumRows(dstEntry.type);
				const int	numCols	= glu::getDataTypeMatrixNumColumns(dstEntry.type);

				for (int colNdx = 0; colNdx < numCols; colNdx++)
				{
					for (int rowNdx = 0; rowNdx < numRows; rowNdx++)
					{
						deUint8*		dstCompPtr	= dstElemPtr + (dstEntry.isRowMajor ? rowNdx*dstEntry.matrixStride + colNdx*compSize
																						: colNdx*dstEntry.matrixStride + rowNdx*compSize);
						const deUint8*	srcCompPtr	= srcElemPtr + (srcEntry.isRowMajor ? rowNdx*srcEntry.matrixStride + colNdx*compSize
																						: colNdx*srcEntry.matrixStride + rowNdx*compSize);

						DE_ASSERT((deIntptr)(srcCompPtr + compSize) - (deIntptr)srcBlockPtr.ptr <= (deIntptr)srcBlockPtr.size);
						DE_ASSERT((deIntptr)(dstCompPtr + compSize) - (deIntptr)dstBlockPtr.ptr <= (deIntptr)dstBlockPtr.size);
						deMemcpy(dstCompPtr, srcCompPtr, compSize);
					}
				}
			}
			else
			{
				DE_ASSERT((deIntptr)(srcElemPtr + scalarSize*compSize) - (deIntptr)srcBlockPtr.ptr <= (deIntptr)srcBlockPtr.size);
				DE_ASSERT((deIntptr)(dstElemPtr + scalarSize*compSize) - (deIntptr)dstBlockPtr.ptr <= (deIntptr)dstBlockPtr.size);
				deMemcpy(dstElemPtr, srcElemPtr, scalarSize*compSize);
			}
		}
	}
}